

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture_p.h
# Opt level: O1

void __thiscall QSwipeGesturePrivate::QSwipeGesturePrivate(QSwipeGesturePrivate *this)

{
  undefined1 *puVar1;
  
  QObjectPrivate::QObjectPrivate((QObjectPrivate *)this,QObjectPrivateVersion);
  (this->super_QGesturePrivate).gestureType = CustomGesture;
  *(undefined8 *)&(this->super_QGesturePrivate).state = 0;
  *(undefined8 *)((long)&(this->super_QGesturePrivate).hotSpot.xp + 4) = 0;
  *(undefined8 *)((long)&(this->super_QGesturePrivate).hotSpot.yp + 4) = 0;
  *(undefined8 *)((long)&(this->super_QGesturePrivate).sceneHotSpot.xp + 4) = 0;
  *(undefined4 *)((long)&(this->super_QGesturePrivate).sceneHotSpot.yp + 4) = 0;
  puVar1 = &(this->super_QGesturePrivate).field_0xa0;
  *puVar1 = *puVar1 & 0xf8;
  *(undefined ***)&this->super_QGesturePrivate = &PTR__QObjectPrivate_007f4658;
  *(undefined8 *)&(this->super_QGesturePrivate).field_0xa4 = 0;
  this->swipeAngle = 0.0;
  this->lastPositions[0].xp = 0;
  this->lastPositions[0].yp = 0;
  this->lastPositions[1].xp = 0;
  this->lastPositions[1].yp = 0;
  this->lastPositions[2].xp = 0;
  this->lastPositions[2].yp = 0;
  this->state = NoGesture;
  this->velocityValue = 0.0;
  (this->time).t1 = -0x8000000000000000;
  (this->time).t2 = -0x8000000000000000;
  return;
}

Assistant:

QSwipeGesturePrivate()
        : horizontalDirection(QSwipeGesture::NoDirection),
          verticalDirection(QSwipeGesture::NoDirection),
          swipeAngle(0),
          state(NoGesture), velocityValue(0)
    {
    }